

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::MultiReporter::addListener(MultiReporter *this,IEventListenerPtr *listener)

{
  ReporterPreferences *pRVar1;
  bool *pbVar2;
  IEventListener *pIVar3;
  
  pIVar3 = listener->m_ptr;
  pRVar1 = &(this->super_IEventListener).m_preferences;
  pRVar1->shouldRedirectStdOut =
       (bool)(pRVar1->shouldRedirectStdOut | (pIVar3->m_preferences).shouldRedirectStdOut);
  pbVar2 = &(this->super_IEventListener).m_preferences.shouldReportAllAssertions;
  *pbVar2 = (bool)(*pbVar2 | (pIVar3->m_preferences).shouldReportAllAssertions);
  std::
  vector<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
  ::_M_insert_rval(&this->m_reporterLikes,
                   (this->m_reporterLikes).
                   super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + this->m_insertedListeners,listener);
  this->m_insertedListeners = this->m_insertedListeners + 1;
  return;
}

Assistant:

void MultiReporter::addListener( IEventListenerPtr&& listener ) {
        updatePreferences(*listener);
        m_reporterLikes.insert(m_reporterLikes.begin() + m_insertedListeners, CATCH_MOVE(listener) );
        ++m_insertedListeners;
    }